

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inipp.h
# Opt level: O2

void __thiscall
inipp::Ini<wchar_t>::generate
          (Ini<wchar_t> *this,basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os)

{
  wostream *pwVar1;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr p_Var3;
  Sections *__range2;
  
  for (p_Var3 = (this->sections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->sections)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    pwVar1 = std::operator<<((wostream *)os,
                             ((this->format).
                              super___shared_ptr<inipp::Format<wchar_t>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->char_section_start);
    pwVar1 = std::operator<<(pwVar1,(wstring *)(p_Var3 + 1));
    pwVar1 = std::operator<<(pwVar1,((this->format).
                                     super___shared_ptr<inipp::Format<wchar_t>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->char_section_end);
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar1);
    for (p_Var2 = p_Var3[2]._M_right; p_Var2 != (_Rb_tree_node_base *)&p_Var3[2]._M_parent;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      pwVar1 = std::operator<<((wostream *)os,(wstring *)(p_Var2 + 1));
      pwVar1 = std::operator<<(pwVar1,((this->format).
                                       super___shared_ptr<inipp::Format<wchar_t>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->char_assign);
      pwVar1 = std::operator<<(pwVar1,(wstring *)(p_Var2 + 2));
      std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar1);
    }
    std::endl<wchar_t,std::char_traits<wchar_t>>((wostream *)os);
  }
  return;
}

Assistant:

void generate(std::basic_ostream<CharT>& os) const {
		for (auto const & sec : sections) {
			os << format->char_section_start << sec.first << format->char_section_end << std::endl;
			for (auto const & val : sec.second) {
				os << val.first << format->char_assign << val.second << std::endl;
			}
			os << std::endl;
		}
	}